

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall MeCab::whatlog::~whatlog(whatlog *this)

{
  ostringstream *in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x178));
  std::__cxx11::ostringstream::~ostringstream(in_RDI);
  return;
}

Assistant:

const char *str() {
    str_ = stream_.str();
    return str_.c_str();
  }